

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

void __thiscall
highs::RbTree<HighsNodeQueue::NodeLowerRbTree>::deleteFixup
          (RbTree<HighsNodeQueue::NodeLowerRbTree> *this,LinkType x,LinkType nilParent)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  LinkType x_00;
  
  if (*this->rootNode != x) {
    do {
      x_00 = nilParent;
      if (x != -1) {
        if (*(long *)(this[2].rootNode[1] + 0x70 + x * 0x90) < 0) break;
        if (x != -1) {
          x_00 = (*(ulong *)(this[2].rootNode[1] + 0x70 + x * 0x90) & 0x7fffffffffffffff) - 1;
        }
      }
      lVar2 = this[2].rootNode[1];
      lVar7 = x_00 * 0x90;
      lVar3 = *(long *)(lVar2 + 0x60 + lVar7);
      uVar9 = (ulong)(x == lVar3);
      lVar6 = *(long *)(lVar2 + lVar7 + 0x60 + uVar9 * 8);
      if ((lVar6 != -1) && (*(long *)(lVar2 + 0x70 + lVar6 * 0x90) < 0)) {
        puVar1 = (ulong *)(lVar2 + 0x70 + lVar6 * 0x90);
        *puVar1 = *puVar1 & 0x7fffffffffffffff;
        puVar1 = (ulong *)(lVar2 + 0x70 + x_00 * 0x90);
        *puVar1 = *puVar1 | 0x8000000000000000;
        rotate(this,x_00,(uint)(x != lVar3));
        lVar6 = *(LinkType *)(x_00 * 0x90 + this[2].rootNode[1] + 0x60 + uVar9 * 8);
      }
      lVar2 = this[2].rootNode[1];
      lVar5 = lVar6 * 0x90;
      plVar8 = (long *)(lVar2 + lVar5 + 0x60);
      if (((*plVar8 == -1) || (-1 < *(long *)(lVar2 + 0x70 + *plVar8 * 0x90))) &&
         ((lVar4 = *(long *)(lVar2 + lVar5 + 0x68), lVar4 == -1 ||
          (-1 < *(long *)(lVar2 + 0x70 + lVar4 * 0x90))))) {
        puVar1 = (ulong *)(lVar2 + 0x70 + lVar5);
        *puVar1 = *puVar1 | 0x8000000000000000;
        x = x_00;
      }
      else {
        if ((plVar8[uVar9] == -1) || (-1 < *(long *)(lVar2 + 0x70 + plVar8[uVar9] * 0x90))) {
          puVar1 = (ulong *)(lVar2 + 0x70 + plVar8[x != lVar3] * 0x90);
          *puVar1 = *puVar1 & 0x7fffffffffffffff;
          puVar1 = (ulong *)(lVar2 + 0x70 + lVar5);
          *puVar1 = *puVar1 | 0x8000000000000000;
          rotate(this,lVar6,(uint)(x == lVar3));
          lVar6 = *(long *)(this[2].rootNode[1] + lVar7 + 0x60 + uVar9 * 8);
        }
        lVar2 = this[2].rootNode[1];
        lVar6 = lVar6 * 0x90;
        *(ulong *)(lVar2 + 0x70 + lVar6) =
             *(ulong *)(lVar2 + 0x70 + lVar7) & 0x8000000000000000 |
             *(ulong *)(lVar2 + 0x70 + lVar6) & 0x7fffffffffffffff;
        puVar1 = (ulong *)(lVar2 + 0x70 + lVar7);
        *puVar1 = *puVar1 & 0x7fffffffffffffff;
        puVar1 = (ulong *)(lVar2 + 0x70 + *(long *)(lVar6 + lVar2 + 0x60 + uVar9 * 8) * 0x90);
        *puVar1 = *puVar1 & 0x7fffffffffffffff;
        rotate(this,x_00,(uint)(x != lVar3));
        x = *this->rootNode;
      }
    } while (x != *this->rootNode);
  }
  if (x != -1) {
    puVar1 = (ulong *)(this[2].rootNode[1] + 0x70 + x * 0x90);
    *puVar1 = *puVar1 & 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }